

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::InsertLocalMinimaIntoAEL(Clipper *this,long64 botY)

{
  IntPoint pt2b;
  IntPoint pt2a;
  TEdge *e2;
  TEdge *e1;
  size_type sVar1;
  reference ppHVar2;
  clipperException *this_00;
  bool bVar3;
  undefined1 local_c8 [8];
  IntPoint pt_1;
  TEdge *e;
  long64 local_a8;
  IntPoint local_a0;
  IntPoint local_90;
  IntPoint local_80;
  value_type local_70;
  HorzJoinRec *hj;
  IntPoint pt2;
  IntPoint pt;
  size_type i;
  TEdge *local_30;
  TEdge *rb;
  TEdge *lb;
  long64 botY_local;
  Clipper *this_local;
  
  lb = (TEdge *)botY;
  botY_local = (long64)this;
  while( true ) {
    bVar3 = false;
    if (*(long *)(this->_vptr_Clipper[-3] +
                 (long)&(this->m_PolyOuts).
                        super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                 ) != 0) {
      bVar3 = (TEdge *)**(long **)(this->_vptr_Clipper[-3] +
                                  (long)&(this->m_PolyOuts).
                                         super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                  ) == lb;
    }
    if (!bVar3) break;
    rb = *(TEdge **)
          (*(long *)(this->_vptr_Clipper[-3] +
                    (long)&(this->m_PolyOuts).
                           super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                    ) + 8);
    local_30 = *(TEdge **)
                (*(long *)(this->_vptr_Clipper[-3] +
                          (long)&(this->m_PolyOuts).
                                 super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                          ) + 0x10);
    InsertEdgeIntoAEL(this,rb);
    InsertScanbeam(this,rb->ytop);
    InsertEdgeIntoAEL(this,local_30);
    bVar3 = IsEvenOddFillType(this,rb);
    if (bVar3) {
      rb->windDelta = 1;
      local_30->windDelta = 1;
    }
    else {
      local_30->windDelta = -rb->windDelta;
    }
    SetWindingCount(this,rb);
    local_30->windCnt = rb->windCnt;
    local_30->windCnt2 = rb->windCnt2;
    if ((local_30->dx - -1e+40 <= -1e-20) || (1e-20 <= local_30->dx - -1e+40)) {
      InsertScanbeam(this,local_30->ytop);
    }
    else {
      AddEdgeToSEL(this,local_30);
      InsertScanbeam(this,local_30->nextInLML->ytop);
    }
    bVar3 = IsContributing(this,rb);
    e1 = rb;
    e2 = local_30;
    if (bVar3) {
      IntPoint::IntPoint((IntPoint *)&i,rb->xcurr,
                         **(long64 **)
                           (this->_vptr_Clipper[-3] +
                           (long)&(this->m_PolyOuts).
                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                           ));
      AddLocalMinPoly(this,e1,e2,(IntPoint *)&i);
    }
    if (((-1 < local_30->outIdx) && (-1e-20 < local_30->dx - -1e+40)) &&
       (local_30->dx - -1e+40 < 1e-20)) {
      for (pt.Y = 0;
          sVar1 = std::vector<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                  ::size(&this->m_HorizJoins), (ulong)pt.Y < sVar1; pt.Y = pt.Y + 1) {
        IntPoint::IntPoint((IntPoint *)&pt2.Y,0,0);
        IntPoint::IntPoint((IntPoint *)&hj,0,0);
        ppHVar2 = std::vector<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                  ::operator[](&this->m_HorizJoins,pt.Y);
        local_70 = *ppHVar2;
        IntPoint::IntPoint(&local_80,local_70->edge->xbot,local_70->edge->ybot);
        IntPoint::IntPoint(&local_90,local_70->edge->xtop,local_70->edge->ytop);
        IntPoint::IntPoint(&local_a0,local_30->xbot,local_30->ybot);
        IntPoint::IntPoint((IntPoint *)&e,local_30->xtop,local_30->ytop);
        pt2a.Y = local_a0.Y;
        pt2a.X = local_a0.X;
        pt2b.Y = local_a8;
        pt2b.X = (long64)e;
        bVar3 = GetOverlapSegment(local_80,local_90,pt2a,pt2b,(IntPoint *)&pt2.Y,(IntPoint *)&hj);
        if (bVar3) {
          AddJoin(this,local_70->edge,local_30,local_70->savedIdx,-1);
        }
      }
    }
    if (rb->nextInAEL != local_30) {
      if (((-1 < local_30->outIdx) && (-1 < local_30->prevInAEL->outIdx)) &&
         (bVar3 = SlopesEqual(local_30->prevInAEL,local_30,
                              (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                           [(long)&(this->m_PolyOuts).
                                                                                                      
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                           ] & 1)), bVar3)) {
        AddJoin(this,local_30,local_30->prevInAEL,-1,-1);
      }
      pt_1.Y = (long64)rb->nextInAEL;
      IntPoint::IntPoint((IntPoint *)local_c8,rb->xcurr,rb->ycurr);
      for (; (TEdge *)pt_1.Y != local_30; pt_1.Y = *(long64 *)(pt_1.Y + 0x70)) {
        if (pt_1.Y == 0) {
          this_00 = (clipperException *)__cxa_allocate_exception(0x28);
          clipperException::clipperException
                    (this_00,"InsertLocalMinimaIntoAEL: missing rightbound!");
          __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
        }
        IntersectEdges(this,local_30,(TEdge *)pt_1.Y,(IntPoint *)local_c8,ipNone);
      }
    }
    ClipperBase::PopLocalMinima
              ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]));
  }
  return;
}

Assistant:

void Clipper::InsertLocalMinimaIntoAEL( const long64 botY)
{
  while(  m_CurrentLM  && ( m_CurrentLM->Y == botY ) )
  {
    TEdge* lb = m_CurrentLM->leftBound;
    TEdge* rb = m_CurrentLM->rightBound;

    InsertEdgeIntoAEL( lb );
    InsertScanbeam( lb->ytop );
    InsertEdgeIntoAEL( rb );

    if (IsEvenOddFillType(*lb))
    {
      lb->windDelta = 1;
      rb->windDelta = 1;
    }
    else
    {
      rb->windDelta = -lb->windDelta;
    }
    SetWindingCount( *lb );
    rb->windCnt = lb->windCnt;
    rb->windCnt2 = lb->windCnt2;

    if( NEAR_EQUAL(rb->dx, HORIZONTAL) )
    {
      //nb: only rightbounds can have a horizontal bottom edge
      AddEdgeToSEL( rb );
      InsertScanbeam( rb->nextInLML->ytop );
    }
    else
      InsertScanbeam( rb->ytop );

    if( IsContributing(*lb) )
      AddLocalMinPoly( lb, rb, IntPoint(lb->xcurr, m_CurrentLM->Y) );

    //if any output polygons share an edge, they'll need joining later ...
    if (rb->outIdx >= 0)
    {
      if (NEAR_EQUAL(rb->dx, HORIZONTAL))
      {
        for (HorzJoinList::size_type i = 0; i < m_HorizJoins.size(); ++i)
        {
          IntPoint pt, pt2; //returned by GetOverlapSegment() but unused here.
          HorzJoinRec* hj = m_HorizJoins[i];
          //if horizontals rb and hj.edge overlap, flag for joining later ...
          if (GetOverlapSegment(IntPoint(hj->edge->xbot, hj->edge->ybot),
            IntPoint(hj->edge->xtop, hj->edge->ytop),
            IntPoint(rb->xbot, rb->ybot),
            IntPoint(rb->xtop, rb->ytop), pt, pt2))
              AddJoin(hj->edge, rb, hj->savedIdx);
        }
      }
    }

    if( lb->nextInAEL != rb )
    {
      if (rb->outIdx >= 0 && rb->prevInAEL->outIdx >= 0 &&
        SlopesEqual(*rb->prevInAEL, *rb, m_UseFullRange))
          AddJoin(rb, rb->prevInAEL);

      TEdge* e = lb->nextInAEL;
      IntPoint pt = IntPoint(lb->xcurr, lb->ycurr);
      while( e != rb )
      {
        if(!e) throw clipperException("InsertLocalMinimaIntoAEL: missing rightbound!");
        //nb: For calculating winding counts etc, IntersectEdges() assumes
        //that param1 will be to the right of param2 ABOVE the intersection ...
        IntersectEdges( rb , e , pt , ipNone); //order important here
        e = e->nextInAEL;
      }
    }
    PopLocalMinima();
  }
}